

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O2

void __thiscall
helics::MessageTimeOperator::MessageTimeOperator
          (MessageTimeOperator *this,
          function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
          *userTimeFunction)

{
  (this->super_FilterOperator)._vptr_FilterOperator =
       (_func_int **)&PTR__MessageTimeOperator_0048cbe8;
  std::function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
  ::function(&this->TimeFunction,userTimeFunction);
  return;
}

Assistant:

MessageTimeOperator::MessageTimeOperator(std::function<Time(Time)> userTimeFunction):
    TimeFunction(std::move(userTimeFunction))
{
}